

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<tcu::Vector<int,_2>_> __thiscall
vkt::shaderexecutor::VariableP::operator_cast_to_ExprP(VariableP *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  undefined8 *in_RSI;
  ExprP<tcu::Vector<int,_2>_> EVar3;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_> local_18;
  SharedPtrStateBase *pSVar2;
  
  local_18.m_ptr = (Expr<tcu::Vector<int,_2>_> *)*in_RSI;
  local_18.m_state = (SharedPtrStateBase *)in_RSI[1];
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  EVar3 = exprP<tcu::Vector<int,2>>((shaderexecutor *)this,&local_18);
  pSVar2 = EVar3.super_ContainerExprPBase<tcu::Vector<int,_2>_>.
           super_ExprPBase<tcu::Vector<int,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>.m_state;
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_18.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_18.m_ptr = (Expr<tcu::Vector<int,_2>_> *)0x0;
      (*(local_18.m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar2 = extraout_RDX;
    }
    LOCK();
    pdVar1 = &(local_18.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_18.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_18.m_state)->_vptr_SharedPtrStateBase[1])();
      pSVar2 = extraout_RDX_00;
    }
  }
  EVar3.super_ContainerExprPBase<tcu::Vector<int,_2>_>.super_ExprPBase<tcu::Vector<int,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>.m_state = pSVar2;
  EVar3.super_ContainerExprPBase<tcu::Vector<int,_2>_>.super_ExprPBase<tcu::Vector<int,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<int,_2>_> *)this;
  return (ExprP<tcu::Vector<int,_2>_>)
         EVar3.super_ContainerExprPBase<tcu::Vector<int,_2>_>.super_ExprPBase<tcu::Vector<int,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<int,_2>_>_>;
}

Assistant:

operator	ExprP<T>	(void) const { return exprP(SharedPtr<const Expr<T> >(*this)); }